

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgm_tree_index_impl.h
# Opt level: O1

vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> * __thiscall
ted_ub::LGMTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexLGM>::
fill_gaps_in_mapping
          (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
           *__return_storage_ptr__,
          LGMTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexLGM> *this,
          TreeIndexLGM *t1,TreeIndexLGM *t2,
          vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *mapping,int k)

{
  longlong *plVar1;
  pointer *pppVar2;
  pointer piVar3;
  bool bVar4;
  int iVar5;
  int t2_begin_gap;
  int y;
  ulong uVar6;
  long lVar7;
  iterator __position;
  int iVar8;
  pointer ppVar9;
  int x;
  int iVar10;
  pair<int,_int> end_gap;
  vector<int,_std::allocator<int>_> t2_count_mapped_desc;
  vector<int,_std::allocator<int>_> t1_count_mapped_desc;
  pair<int,_int> local_80;
  vector<int,_std::allocator<int>_> t2_count_mapped_anc;
  vector<int,_std::allocator<int>_> t1_count_mapped_anc;
  
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector
            (&t1_count_mapped_desc,(long)(t1->super_Constants).tree_size_,
             (allocator_type *)&t2_count_mapped_desc);
  std::vector<int,_std::allocator<int>_>::vector
            (&t2_count_mapped_desc,(long)(t2->super_Constants).tree_size_,
             (allocator_type *)&t1_count_mapped_anc);
  std::vector<int,_std::allocator<int>_>::vector
            (&t1_count_mapped_anc,(long)(t1->super_Constants).tree_size_,
             (allocator_type *)&t2_count_mapped_anc);
  std::vector<int,_std::allocator<int>_>::vector
            (&t2_count_mapped_anc,(long)(t2->super_Constants).tree_size_,(allocator_type *)&end_gap)
  ;
  get_mapped_ancestors_counts(this,t1,t2,mapping,&t1_count_mapped_anc,&t2_count_mapped_anc);
  end_gap.second = (t2->super_Constants).tree_size_;
  end_gap.first = (t1->super_Constants).tree_size_;
  std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
  emplace_back<std::pair<int,int>>
            ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)mapping,&end_gap);
  end_gap.first = 0;
  end_gap.second = 0;
  ppVar9 = (mapping->super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)
           ._M_impl.super__Vector_impl_data._M_start;
  if (ppVar9 != (mapping->
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                _M_impl.super__Vector_impl_data._M_finish) {
    uVar6 = 0xffffffff;
    iVar10 = -1;
    do {
      iVar8 = ppVar9->first;
      iVar5 = ppVar9->second;
      end_gap = *ppVar9;
      x = iVar10 + 1;
      t2_begin_gap = (int)uVar6;
      if ((iVar8 - iVar10 == 1) || (iVar5 - t2_begin_gap == 1)) {
        if (x < iVar8) {
          piVar3 = (t1->super_PostLToParent).postl_to_parent_.
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start;
          lVar7 = (long)x;
          do {
            if (lVar7 < (long)(t1->super_Constants).tree_size_ + -1) {
              t1_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[piVar3[lVar7]] =
                   t1_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[piVar3[lVar7]] +
                   t1_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar7];
            }
            lVar7 = lVar7 + 1;
          } while (lVar7 < iVar8);
        }
        if (iVar8 < (t1->super_Constants).tree_size_ + -1) {
          iVar10 = (t1->super_PostLToParent).postl_to_parent_.
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start[iVar8];
          t1_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[iVar10] =
               t1_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[iVar8] +
               t1_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[iVar10] + 1;
        }
        if (t2_begin_gap + 1 < iVar5) {
          piVar3 = (t2->super_PostLToParent).postl_to_parent_.
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start;
          lVar7 = (long)(t2_begin_gap + 1);
          do {
            if (lVar7 < (long)(t2->super_Constants).tree_size_ + -1) {
              t2_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[piVar3[lVar7]] =
                   t2_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[piVar3[lVar7]] +
                   t2_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar7];
            }
            lVar7 = lVar7 + 1;
          } while (lVar7 < iVar5);
        }
        if (iVar5 < (t2->super_Constants).tree_size_ + -1) {
          iVar10 = (t2->super_PostLToParent).postl_to_parent_.
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start[iVar5];
          t2_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[iVar10] =
               t2_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[iVar5] +
               t2_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[iVar10] + 1;
        }
        __position._M_current =
             (__return_storage_ptr__->
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl
             .super__Vector_impl_data._M_finish;
        if (__position._M_current !=
            (__return_storage_ptr__->
            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) goto LAB_001096e6;
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
        _M_realloc_insert<std::pair<int,int>const&>
                  ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                   __return_storage_ptr__,__position,&end_gap);
      }
      else {
        uVar6 = (ulong)(t2_begin_gap + 1);
        while ((y = (int)uVar6, x < iVar8 && (y < iVar5))) {
          plVar1 = &(this->
                    super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexLGM>
                    ).subproblem_counter_;
          *plVar1 = *plVar1 + 1;
          if ((t1_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[x] ==
               t2_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[y]) &&
             ((t1_count_mapped_anc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[x] ==
               t2_count_mapped_anc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[y] && (bVar4 = k_relevant(this,t1,t2,x,y,k), bVar4))
             )) {
            bVar4 = if_in_corresponding_regions
                              (this,t1,t2,iVar10,x,end_gap.first,t2_begin_gap,y,end_gap.second);
            if (bVar4) {
              if (x < (t1->super_Constants).tree_size_ + -1) {
                iVar10 = (t1->super_PostLToParent).postl_to_parent_.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[x];
                t1_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[iVar10] =
                     t1_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[x] +
                     t1_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[iVar10] + 1;
              }
              if (y < (t2->super_Constants).tree_size_ + -1) {
                iVar10 = (t2->super_PostLToParent).postl_to_parent_.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[y];
                t2_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[iVar10] =
                     t2_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[y] +
                     t2_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[iVar10] + 1;
              }
              local_80.first = x;
              local_80.second = y;
              std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
              emplace_back<std::pair<int,int>>
                        ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                         __return_storage_ptr__,&local_80);
              iVar10 = x;
              goto LAB_0010970b;
            }
          }
          if (x - iVar8 < y - iVar5) {
            if (x < (t1->super_Constants).tree_size_ + -1) {
              t1_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start
              [(t1->super_PostLToParent).postl_to_parent_.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start[x]] =
                   t1_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start
                   [(t1->super_PostLToParent).postl_to_parent_.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start[x]] +
                   t1_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[x];
            }
            x = x + 1;
          }
          else {
            if (y < (t2->super_Constants).tree_size_ + -1) {
              t2_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start
              [(t2->super_PostLToParent).postl_to_parent_.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start[y]] =
                   t2_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start
                   [(t2->super_PostLToParent).postl_to_parent_.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start[y]] +
                   t2_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[y];
            }
            uVar6 = (ulong)(y + 1);
          }
        }
        if (y < iVar5) {
          piVar3 = (t2->super_PostLToParent).postl_to_parent_.
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start;
          do {
            if (y < (t2->super_Constants).tree_size_ + -1) {
              t2_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[piVar3[y]] =
                   t2_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[piVar3[y]] +
                   t2_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[y];
            }
            iVar5 = iVar5 + -1;
          } while (y != iVar5);
        }
        if (x < iVar8) {
          piVar3 = (t1->super_PostLToParent).postl_to_parent_.
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start;
          do {
            if (x < (t1->super_Constants).tree_size_ + -1) {
              t1_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[piVar3[x]] =
                   t1_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[piVar3[x]] +
                   t1_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[x];
            }
            iVar8 = iVar8 + -1;
          } while (x != iVar8);
        }
        if (end_gap.first < (t1->super_Constants).tree_size_ + -1) {
          iVar10 = (t1->super_PostLToParent).postl_to_parent_.
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start[end_gap.first];
          t1_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[iVar10] =
               t1_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[end_gap.first] +
               t1_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[iVar10] + 1;
        }
        if (end_gap.second < (t2->super_Constants).tree_size_ + -1) {
          iVar10 = (t2->super_PostLToParent).postl_to_parent_.
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start[end_gap.second];
          t2_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[iVar10] =
               t2_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[end_gap.second] +
               t2_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[iVar10] + 1;
        }
        __position._M_current =
             (__return_storage_ptr__->
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl
             .super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
          _M_realloc_insert<std::pair<int,int>const&>
                    ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                     __return_storage_ptr__,__position,&end_gap);
        }
        else {
LAB_001096e6:
          *__position._M_current = end_gap;
          pppVar2 = &(__return_storage_ptr__->
                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)
                     ._M_impl.super__Vector_impl_data._M_finish;
          *pppVar2 = *pppVar2 + 1;
        }
      }
      uVar6 = (ulong)end_gap >> 0x20;
      ppVar9 = ppVar9 + 1;
      iVar10 = end_gap.first;
LAB_0010970b:
    } while (ppVar9 != (mapping->
                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
  }
  pppVar2 = &(__return_storage_ptr__->
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl
             .super__Vector_impl_data._M_finish;
  *pppVar2 = *pppVar2 + -1;
  if (t2_count_mapped_anc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(t2_count_mapped_anc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)t2_count_mapped_anc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)t2_count_mapped_anc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (t1_count_mapped_anc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(t1_count_mapped_anc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)t1_count_mapped_anc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)t1_count_mapped_anc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (t2_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(t2_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)t2_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)t2_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  if (t1_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(t1_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)t1_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)t1_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<int, int>> LGMTreeIndex<CostModel, TreeIndex>::fill_gaps_in_mapping(
    const TreeIndex& t1, const TreeIndex& t2,
    std::vector<std::pair<int, int>>& mapping, const int k) {
  
  // In result_mapping we store the output of this function.
  std::vector<std::pair<int, int>> result_mapping;
  
  // The counts for mapped descendants and nodes to the left must be maintained.
  std::vector<int> t1_count_mapped_desc(t1.tree_size_);
  std::vector<int> t2_count_mapped_desc(t2.tree_size_);
    
  // The counts for mapped ancestors.
  std::vector<int> t1_count_mapped_anc(t1.tree_size_);
  std::vector<int> t2_count_mapped_anc(t2.tree_size_);
  get_mapped_ancestors_counts(t1, t2, mapping, t1_count_mapped_anc, t2_count_mapped_anc);
  
  // Add a dummy mapping pair to cover the gap from the last mapping until the
  // ends of the trees.
  mapping.push_back({t1.tree_size_, t2.tree_size_});
  
  std::pair<int, int> begin_gap = {-1, -1};
  std::pair<int, int> end_gap;
  std::vector<std::pair<int, int>>::iterator end_gap_it = mapping.begin();
  
  while (end_gap_it != mapping.end()) {
    end_gap = *end_gap_it;
    // If there is no gap, continue with the next mapped pair.
    if (end_gap.first - begin_gap.first == 1 || end_gap.second - begin_gap.second == 1) {
      // Update the counts for nodes between begin_gap and end_gap, if any,
      // as not-mapped nodes.
      for (int not_mapped_first = begin_gap.first + 1; not_mapped_first < end_gap.first; ++not_mapped_first) {
        update_desc_when_not_mapped(not_mapped_first, t1_count_mapped_desc, t1.postl_to_parent_, t1.tree_size_);
      }
      // Update the counts for nodes in end_gap as mapped nodes.
      update_desc_when_mapped(end_gap.first, t1_count_mapped_desc, t1.postl_to_parent_, t1.tree_size_);
      // Update the counts for nodes between begin_gap and end_gap, if any,
      // as not-mapped nodes.
      for (int not_mapped_second = begin_gap.second + 1; not_mapped_second < end_gap.second; ++not_mapped_second) {
        update_desc_when_not_mapped(not_mapped_second, t2_count_mapped_desc, t2.postl_to_parent_, t2.tree_size_);
      }
      // Update the counts for nodes in end_gap as mapped nodes.
      update_desc_when_mapped(end_gap.second, t2_count_mapped_desc, t2.postl_to_parent_, t2.tree_size_);
      // Push the end of the current gap to the result.
      result_mapping.push_back(end_gap);
      // Update the begin of the next gap.
      begin_gap = end_gap;
      ++end_gap_it;
      continue;
    }
    // There is a gap --> try to map nodes --> at the first node pair mapped,
    // change the gap and continue the loop.
    int i = begin_gap.first + 1;
    int i_last = end_gap.first - 1;
    int j = begin_gap.second + 1;
    int j_last = end_gap.second - 1;
    bool mapped_in_gap = false;
    while (i <= i_last && j <= j_last) {
      ++subproblem_counter_;
      if (t1_count_mapped_desc[i] == t2_count_mapped_desc[j] &&
          t1_count_mapped_anc[i] == t2_count_mapped_anc[j] &&
          k_relevant(t1, t2, i, j, k) &&
          if_in_corresponding_regions(t1, t2, begin_gap.first, i, end_gap.first, begin_gap.second, j, end_gap.second)) {
        // Map (i,j) + push to result mapping + update counts for both nodes
        // incremented as mapped.
        update_desc_when_mapped(i, t1_count_mapped_desc, t1.postl_to_parent_, t1.tree_size_);
        update_desc_when_mapped(j, t2_count_mapped_desc, t2.postl_to_parent_, t2.tree_size_);
        result_mapping.push_back({i, j});
        begin_gap = {i, j};
        mapped_in_gap = true;
        break;
      } else {
        // Update counts for the incremented node as non-mapped.
        if (i_last - i > j_last - j) {
          update_desc_when_not_mapped(i, t1_count_mapped_desc, t1.postl_to_parent_, t1.tree_size_);
          ++i;
        } else {
          update_desc_when_not_mapped(j, t2_count_mapped_desc, t2.postl_to_parent_, t2.tree_size_);
          ++j;
        }
      }
    }
    if (mapped_in_gap) {
      continue;
    } else {
      // Check the case when only one of i or j incremented beyond the limit.
      // The gap in one of the trees has been used up.
      // Nothing mapped in the gap.
      for (int j_missing = j; j_missing <= j_last; ++j_missing) {
        update_desc_when_not_mapped(j, t2_count_mapped_desc, t2.postl_to_parent_, t2.tree_size_);
      }
      for (int i_missing = i; i_missing <= i_last; ++i_missing) {
        update_desc_when_not_mapped(i, t1_count_mapped_desc, t1.postl_to_parent_, t1.tree_size_);
      }
      // Update the counts for nodes in end_gap as mapped nodes.
      update_desc_when_mapped(end_gap.first, t1_count_mapped_desc, t1.postl_to_parent_, t1.tree_size_);
      update_desc_when_mapped(end_gap.second, t2_count_mapped_desc, t2.postl_to_parent_, t2.tree_size_);
      // Push the end of the current gap to the result.
      result_mapping.push_back(end_gap);
      // Update the begin of the next gap.
      begin_gap = end_gap;
      ++end_gap_it;
      continue;
    }
  }
  // Remove the last dummy mapping.
  result_mapping.pop_back();
  return result_mapping;
}